

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string * chaiscript::json::JSON::json_escape(string *__return_storage_ptr__,string *str)

{
  char __c;
  pointer pcVar1;
  size_type sVar2;
  char *__s;
  size_type sVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (str->_M_dataplus)._M_p;
  sVar2 = str->_M_string_length;
  sVar3 = 0;
  do {
    if (sVar2 == sVar3) {
      return __return_storage_ptr__;
    }
    __c = pcVar1[sVar3];
    switch(__c) {
    case '\b':
      __s = "\\b";
      break;
    case '\t':
      __s = "\\t";
      break;
    case '\n':
      __s = "\\n";
      break;
    case '\v':
switchD_003a960e_caseD_b:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,__c);
      goto LAB_003a9666;
    case '\f':
      __s = "\\f";
      break;
    case '\r':
      __s = "\\r";
      break;
    default:
      __s = "\\\\";
      if (__c != '\\') {
        if (__c != '\"') goto switchD_003a960e_caseD_b;
        __s = "\\\"";
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,__s);
LAB_003a9666:
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

static std::string json_escape(const std::string &str) {
      std::string output;
      for (char i : str) {
        switch (i) {
          case '\"':
            output += "\\\"";
            break;
          case '\\':
            output += "\\\\";
            break;
          case '\b':
            output += "\\b";
            break;
          case '\f':
            output += "\\f";
            break;
          case '\n':
            output += "\\n";
            break;
          case '\r':
            output += "\\r";
            break;
          case '\t':
            output += "\\t";
            break;
          default:
            output += i;
            break;
        }
      }
      return output;
    }